

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::HierarchicalValueExpression::HierarchicalValueExpression
          (HierarchicalValueExpression *this,Scope *scope,ValueSymbol *symbol,
          HierarchicalReference *ref,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  ValueSymbol *in_RCX;
  undefined8 in_RDX;
  Scope *in_RSI;
  SourceLocation in_RDI;
  SourceLocation in_R8;
  Scope *in_R9;
  Compilation *unaff_retaddr;
  
  sourceRange_00.endLoc = in_R8;
  sourceRange_00.startLoc = in_RDI;
  ValueExpressionBase::ValueExpressionBase
            ((ValueExpressionBase *)in_RSI,(ExpressionKind)((ulong)in_RDX >> 0x20),in_RCX,
             sourceRange_00);
  memcpy((void *)((long)in_RDI + 0x38),in_RCX,0x28);
  *(SourceLocation *)((long)in_RDI + 0x40) = in_RDI;
  bVar1 = HierarchicalReference::isUpward((HierarchicalReference *)in_RCX);
  if (bVar1) {
    Scope::getCompilation(in_RSI);
    Compilation::noteUpwardReference(unaff_retaddr,in_R9,(HierarchicalReference *)in_R8);
  }
  return;
}

Assistant:

HierarchicalValueExpression::HierarchicalValueExpression(const Scope& scope,
                                                         const ValueSymbol& symbol,
                                                         const HierarchicalReference& ref,
                                                         SourceRange sourceRange) :
    ValueExpressionBase(ExpressionKind::HierarchicalValue, symbol, sourceRange), ref(ref) {
    SLANG_ASSERT(ref.target == &symbol);
    this->ref.expr = this;

    if (this->ref.isUpward())
        scope.getCompilation().noteUpwardReference(scope, this->ref);
}